

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_block.cpp
# Opt level: O2

DominatorIterator * __thiscall
spvtools::val::BasicBlock::structural_dom_begin
          (DominatorIterator *__return_storage_ptr__,BasicBlock *this)

{
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<const_spvtools::val::BasicBlock_*(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/basic_block.cpp:139:34)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<const_spvtools::val::BasicBlock_*(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/basic_block.cpp:139:34)>
             ::_M_manager;
  __return_storage_ptr__->current_ = this;
  std::function<const_spvtools::val::BasicBlock_*(const_spvtools::val::BasicBlock_*)>::function
            (&__return_storage_ptr__->dom_func_,
             (function<const_spvtools::val::BasicBlock_*(const_spvtools::val::BasicBlock_*)> *)
             &local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

BasicBlock::DominatorIterator BasicBlock::structural_dom_begin() {
  return DominatorIterator(this, [](const BasicBlock* b) {
    return b->immediate_structural_dominator();
  });
}